

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateTerminalEnum
          (GrammarOutputC *this,String *str,Lex *lex,String *name,String *prefix)

{
  Grammar *this_00;
  char *__lhs;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalVec;
  undefined1 local_d8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_type *local_a0;
  String dest;
  undefined1 local_70 [8];
  anon_class_32_4_842515b9 listEnumValues;
  anon_class_8_1_9f31c5d8 local_40 [2];
  
  this_00 = (this->super_GrammarOutput).pGrammar;
  if (this_00 == (Grammar *)0x0) {
    dest.field_2._8_8_ = 0;
  }
  else {
    local_a0 = &dest._M_string_length;
    dest._M_dataplus._M_p = (pointer)0x0;
    dest._M_string_length._0_1_ = 0;
    auStack_f8 = (undefined1  [8])0x0;
    terminalVec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    terminalVec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._16_8_ = prefix;
    local_d8._8_8_ =
         Grammar::CreateTerminalVector
                   (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_f8,lex);
    local_d8._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)auStack_f8;
    dest.field_2._8_8_ = local_d8._8_8_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,"//////////////////////////// ",name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator," ////////////////////////////\n\n");
    std::__cxx11::string::append((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,"namespace ",&this->namespaceName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,"\n{\n\n");
      std::__cxx11::string::append((string *)&local_a0);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    }
    __lhs = "enum ";
    if (this->useEnumClasses != false) {
      __lhs = "enum class ";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,__lhs,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,"\n{\n");
    std::__cxx11::string::append((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    local_70 = (undefined1  [8])(local_d8 + 8);
    listEnumValues.str = (String *)local_d8._16_8_;
    listEnumValues.prefix = (String *)local_d8;
    listEnumValues.enumValueNameGenerator = local_40;
    local_40[0].terminalVec._0_1_ = 0;
    listEnumValues.size = (size_t *)&local_a0;
    createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1669:16)>
    ::anon_class_32_4_842515b9::operator()
              ((anon_class_32_4_842515b9 *)local_70,(String *)&listEnumValues.enumValueNameGenerator
              );
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    std::__cxx11::string::append((char *)&local_a0);
    if (this->createEnumStrings == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x18),"\nconstexpr char const* const StringifyEnum",name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x18),"[] =\n{\n");
      std::__cxx11::string::append((string *)&local_a0);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)(local_d8 + 0x18));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&listEnumValues.enumValueNameGenerator,"\"",
                 (allocator<char> *)(local_d8 + 0x18));
      createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1669:16)>
      ::anon_class_32_4_842515b9::operator()
                ((anon_class_32_4_842515b9 *)local_70,
                 (String *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::append((char *)&local_a0);
    }
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x18),"\n} // namespace ",&this->namespaceName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x18),"\n");
      std::__cxx11::string::append((string *)&local_a0);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)(local_d8 + 0x18));
    }
    std::__cxx11::string::swap((string *)str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_f8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return dest.field_2._8_8_;
}

Assistant:

size_t GrammarOutputC::CreateTerminalEnum(String& str, const Lex& lex, const String& name,
                                          const String& prefix) const {
    if (!pGrammar)
        return 0u;

    String dest;

    std::vector<String> terminalVec;
    const auto size = pGrammar->CreateTerminalVector(terminalVec, lex);

    // Generate strings
    createEnum(dest, name, prefix, size,
               [&](size_t index) {
                   return terminalVec[index];
               });

    str.swap(dest);

    return size;
}